

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

RecyclableObject *
Js::JavascriptOperators::CacheIteratorNext(RecyclableObject *iterator,ScriptContext *scriptContext)

{
  bool bVar1;
  Var aValue;
  ThreadContext *this;
  JavascriptLibrary *this_00;
  ThreadContext *threadContext;
  Var nextFunc;
  ScriptContext *scriptContext_local;
  RecyclableObject *iterator_local;
  
  aValue = GetPropertyNoCache(iterator,0x107,scriptContext);
  this = ScriptContext::GetThreadContext(scriptContext);
  bVar1 = JavascriptConversion::IsCallable(aValue);
  if (bVar1) {
    iterator_local = VarTo<Js::RecyclableObject>(aValue);
  }
  else {
    bVar1 = ThreadContext::RecordImplicitException(this);
    if (bVar1) {
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
    }
    this_00 = ScriptContext::GetLibrary(scriptContext);
    iterator_local = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  }
  return iterator_local;
}

Assistant:

RecyclableObject* JavascriptOperators::CacheIteratorNext(RecyclableObject* iterator, ScriptContext* scriptContext)
    {
        Var nextFunc = JavascriptOperators::GetPropertyNoCache(iterator, PropertyIds::next, scriptContext);

        ThreadContext *threadContext = scriptContext->GetThreadContext();
        if (!JavascriptConversion::IsCallable(nextFunc))
        {
            if (!threadContext->RecordImplicitException())
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
        }
        return VarTo<RecyclableObject>(nextFunc);
    }